

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O0

vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> * __thiscall
anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>::spans_v
          (vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *__return_storage_ptr__,
          Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *this)

{
  double dVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type __n;
  double *pdVar4;
  reference pvVar5;
  Interval local_108;
  undefined1 local_f8 [16];
  Ref<anurbs::NurbsSurfaceGeometry<2L>_> local_e8;
  double local_d8;
  double v1;
  Ref<anurbs::NurbsSurfaceGeometry<2L>_> local_c0;
  double local_b0;
  double v0;
  Index i;
  size_type local_98;
  Index nb_spans;
  double local_80;
  Index local_78;
  Index last_span;
  double local_60;
  Index local_58;
  Index first_span;
  shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_> local_40;
  undefined1 local_30 [8];
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> knots;
  Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *this_local;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *result;
  
  knots.
  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
  _16_8_ = this;
  Ref<anurbs::NurbsSurfaceGeometry<2L>_>::operator->
            ((Ref<anurbs::NurbsSurfaceGeometry<2L>_> *)&local_40);
  peVar3 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_40);
  NurbsSurfaceGeometry<2L>::knots_v
            ((Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)local_30,
             peVar3);
  std::shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_>::~shared_ptr(&local_40);
  iVar2 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])();
  (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[5])();
  local_60 = Interval::t0((Interval *)&last_span);
  local_58 = Nurbs::
             upper_span<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                       (CONCAT44(extraout_var,iVar2),
                        (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                        local_30,&local_60);
  iVar2 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])();
  (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[5])();
  local_80 = Interval::t1((Interval *)&nb_spans);
  local_78 = Nurbs::
             lower_span<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                       (CONCAT44(extraout_var_00,iVar2),
                        (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                        local_30,&local_80);
  __n = (local_78 - local_58) + 1;
  i._7_1_ = 0;
  local_98 = __n;
  std::allocator<anurbs::Interval>::allocator((allocator<anurbs::Interval> *)((long)&i + 6));
  std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::vector
            (__return_storage_ptr__,__n,(allocator<anurbs::Interval> *)((long)&i + 6));
  std::allocator<anurbs::Interval>::~allocator((allocator<anurbs::Interval> *)((long)&i + 6));
  for (v0 = 0.0; (long)v0 < (long)local_98; v0 = (double)((long)v0 + 1)) {
    surface_geometry((Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *)&v1);
    Ref<anurbs::NurbsSurfaceGeometry<2L>_>::operator->(&local_c0);
    peVar3 = std::
             __shared_ptr_access<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_c0);
    pdVar4 = NurbsSurfaceGeometry<2L>::knot_v(peVar3,local_58 + (long)v0);
    dVar1 = *pdVar4;
    std::shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_>::~shared_ptr
              ((shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_> *)&local_c0);
    Ref<anurbs::NurbsSurfaceGeometry<2L>_>::~Ref((Ref<anurbs::NurbsSurfaceGeometry<2L>_> *)&v1);
    local_b0 = dVar1;
    surface_geometry((Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *)local_f8);
    Ref<anurbs::NurbsSurfaceGeometry<2L>_>::operator->(&local_e8);
    peVar3 = std::
             __shared_ptr_access<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_e8);
    pdVar4 = NurbsSurfaceGeometry<2L>::knot_v(peVar3,local_58 + 1 + (long)v0);
    dVar1 = *pdVar4;
    std::shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_>::~shared_ptr
              ((shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_> *)&local_e8);
    Ref<anurbs::NurbsSurfaceGeometry<2L>_>::~Ref((Ref<anurbs::NurbsSurfaceGeometry<2L>_> *)local_f8)
    ;
    local_d8 = dVar1;
    Interval::Interval(&local_108,local_b0,dVar1);
    pvVar5 = std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::operator[]
                       (__return_storage_ptr__,(size_type)v0);
    pvVar5->m_t0 = local_108.m_t0;
    pvVar5->m_t1 = local_108.m_t1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Interval> spans_v() const override
    {
        auto knots = m_surface_geometry->knots_v();

        Index first_span = Nurbs::upper_span(degree_v(), knots, domain_v().t0());
        Index last_span = Nurbs::lower_span(degree_v(), knots, domain_v().t1());

        Index nb_spans = last_span - first_span + 1;

        std::vector<Interval> result(nb_spans);

        for (Index i = 0; i < nb_spans; i++) {
            double v0 = surface_geometry()->knot_v(first_span + i);
            double v1 = surface_geometry()->knot_v(first_span + i + 1);

            result[i] = Interval(v0, v1);
        }

        return result;
    }